

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

DataTypeSyntax * __thiscall
slang::parsing::Parser::parseDataType
          (Parser *this,bitmask<slang::parsing::detail::TypeOptions> options)

{
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> elements;
  Token signing_00;
  Token keyword_00;
  Token interfaceKeyword_00;
  Token openParen_00;
  Token placeholder;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> elements_00;
  Token placeholder_00;
  Token keyword_01;
  Token virtualKeyword_00;
  Token typeKeyword;
  Token signing_01;
  Token signing_02;
  Token name_00;
  Token closeParen;
  bool bVar1;
  bool bVar2;
  SyntaxNode *pSVar3;
  DotMemberClauseSyntax *pDVar4;
  Info *pIVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  long in_RDI;
  Token TVar7;
  Token TVar8;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> dimensions;
  Token signing;
  uint32_t index;
  ExpressionSyntax *expr;
  Token openParen;
  Token keyword_1;
  ParameterValueAssignmentSyntax *parameters;
  Token name;
  Token interfaceKeyword;
  Token virtualKeyword;
  EnumTypeSyntax *result;
  Token signing_1;
  Token keyword;
  SyntaxKind type;
  TokenKind kind;
  Parser *in_stack_00000390;
  ParserBase *in_stack_fffffffffffffc68;
  SyntaxKind kind_00;
  Parser *in_stack_fffffffffffffc70;
  undefined6 in_stack_fffffffffffffc78;
  TokenKind in_stack_fffffffffffffc7e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc80;
  Parser *in_stack_fffffffffffffc88;
  ParserBase *in_stack_fffffffffffffc90;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffca0;
  Parser *in_stack_fffffffffffffca8;
  DotMemberClauseSyntax *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  undefined1 allowNew;
  ParserBase *in_stack_fffffffffffffcc0;
  Parser *in_stack_fffffffffffffcc8;
  undefined6 in_stack_fffffffffffffcd0;
  undefined2 in_stack_fffffffffffffcd6;
  TokenKind TVar9;
  SourceLocation in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  DiagCode in_stack_fffffffffffffce4;
  TokenKind kind_01;
  ParserBase *in_stack_fffffffffffffd00;
  ParserBase *in_stack_fffffffffffffd38;
  _Optional_payload_base<slang::DiagCode> in_stack_fffffffffffffd42;
  Parser *in_stack_fffffffffffffd68;
  bitmask<slang::parsing::detail::TypeOptions> local_278;
  underlying_type local_274;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> local_270;
  Token local_260;
  Token local_250;
  Parser *in_stack_fffffffffffffdf0;
  TokenKind local_1f8;
  bitmask<slang::parsing::detail::TypeOptions> local_1e0;
  underlying_type local_1dc;
  Token local_1d8;
  undefined8 local_1c8;
  Info *local_1c0;
  undefined8 local_1b8;
  Info *local_1b0;
  ExpressionSyntax *local_1a8;
  Token local_1a0;
  Token local_190;
  ParameterValueAssignmentSyntax *local_180;
  Info *local_178;
  undefined8 local_170;
  Info *local_168;
  undefined8 local_160;
  Info *local_158;
  ParameterValueAssignmentSyntax *local_150;
  Token local_148;
  Token local_138;
  Token local_128;
  StructUnionTypeSyntax *local_118;
  StructUnionTypeSyntax *local_110;
  Token local_108;
  Token local_f8;
  SourceLocation local_e8;
  undefined4 local_dc;
  bitmask<slang::parsing::detail::TypeOptions> local_d8;
  underlying_type local_d4;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> local_d0;
  undefined1 local_c0 [56];
  undefined8 local_88;
  Info *local_80;
  undefined8 local_78;
  Info *local_70;
  Token local_68;
  Token local_58;
  SyntaxKind local_44;
  Token local_40;
  TokenKind local_2a;
  undefined4 local_28;
  undefined2 local_24;
  undefined4 local_1e;
  undefined2 local_1a;
  StructUnionTypeSyntax *local_8;
  
  allowNew = (undefined1)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc80._M_extent_value,
                           in_stack_fffffffffffffc7e);
  if (bVar1) {
    std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
              ((optional<slang::DiagCode> *)in_stack_fffffffffffffc70,
               (DiagCode *)in_stack_fffffffffffffc68);
    local_24 = local_1a;
    local_28 = local_1e;
    ParserBase::skipToken
              (in_stack_fffffffffffffd38,(optional<slang::DiagCode>)in_stack_fffffffffffffd42);
  }
  local_40 = ParserBase::peek(in_stack_fffffffffffffc68);
  local_2a = local_40.kind;
  local_44 = slang::syntax::SyntaxFacts::getIntegerType(local_40.kind);
  if (local_44 == Unknown) {
    local_44 = slang::syntax::SyntaxFacts::getKeywordType(local_2a);
    if (local_44 == Unknown) {
      if (local_2a == EnumKeyword) {
        local_118 = (StructUnionTypeSyntax *)parseEnum(in_stack_fffffffffffffdf0);
        local_110 = local_118;
        pSVar3 = std::exchange<slang::syntax::SyntaxNode_const*,slang::syntax::EnumTypeSyntax*>
                           ((SyntaxNode **)in_stack_fffffffffffffc70,
                            (EnumTypeSyntax **)in_stack_fffffffffffffc68);
        (local_110->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
             pSVar3;
        local_8 = local_110;
      }
      else if (local_2a == StructKeyword) {
        local_8 = parseStructUnion(in_stack_00000390,options.m_bits);
      }
      else if (local_2a == TypeKeyword) {
        local_190 = ParserBase::consume(in_stack_fffffffffffffc90);
        local_1a0 = ParserBase::expect(in_stack_fffffffffffffd00,(TokenKind)((ulong)in_RDI >> 0x30))
        ;
        local_1a8 = parseExpression(in_stack_fffffffffffffc70);
        TVar7 = local_190;
        TVar8 = local_1a0;
        pIVar5 = (Info *)(in_RDI + 0xe0);
        local_1b8._0_2_ = local_190.kind;
        local_1b8._2_1_ = local_190._2_1_;
        local_1b8._3_1_ = local_190.numFlags.raw;
        local_1b8._4_4_ = local_190.rawLen;
        local_190.info = TVar7.info;
        local_1b0 = local_190.info;
        local_1c8._0_2_ = local_1a0.kind;
        local_1c8._2_1_ = local_1a0._2_1_;
        local_1c8._3_1_ = local_1a0.numFlags.raw;
        local_1c8._4_4_ = local_1a0.rawLen;
        local_1a0.info = TVar8.info;
        local_1c0 = local_1a0.info;
        local_1a0 = TVar8;
        local_190 = TVar7;
        local_1d8 = ParserBase::expect(in_stack_fffffffffffffd00,(TokenKind)((ulong)in_RDI >> 0x30))
        ;
        typeKeyword.info = (Info *)in_stack_fffffffffffffc90;
        typeKeyword._0_8_ = in_stack_fffffffffffffc88;
        openParen_00.rawLen._2_2_ = in_stack_fffffffffffffc7e;
        openParen_00._0_6_ = in_stack_fffffffffffffc78;
        openParen_00.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
        closeParen.info = pIVar5;
        closeParen._0_8_ = in_stack_fffffffffffffca0;
        local_8 = (StructUnionTypeSyntax *)
                  slang::syntax::SyntaxFactory::typeReference
                            ((SyntaxFactory *)local_1d8.info,typeKeyword,openParen_00,
                             (ExpressionSyntax *)local_1d8._0_8_,closeParen);
      }
      else if (local_2a == UnionKeyword) {
        local_8 = parseStructUnion(in_stack_00000390,options.m_bits);
      }
      else if (local_2a == VirtualKeyword) {
        local_128 = ParserBase::consume(in_stack_fffffffffffffc90);
        kind_01 = (TokenKind)((ulong)in_RDI >> 0x30);
        local_138 = ParserBase::consumeIf
                              (&in_stack_fffffffffffffc70->super_ParserBase,
                               (TokenKind)((ulong)in_stack_fffffffffffffc68 >> 0x30));
        local_148 = ParserBase::expect(in_stack_fffffffffffffd00,kind_01);
        local_150 = parseParameterValueAssignment(in_stack_fffffffffffffd68);
        TVar7 = local_128;
        TVar8 = local_138;
        local_160._0_2_ = local_128.kind;
        local_160._2_1_ = local_128._2_1_;
        local_160._3_1_ = local_128.numFlags.raw;
        local_160._4_4_ = local_128.rawLen;
        local_128.info = TVar7.info;
        local_158 = local_128.info;
        local_170._0_2_ = local_138.kind;
        local_170._2_1_ = local_138._2_1_;
        local_170._3_1_ = local_138.numFlags.raw;
        local_170._4_4_ = local_138.rawLen;
        local_138.info = TVar8.info;
        local_168 = local_138.info;
        local_180 = (ParameterValueAssignmentSyntax *)local_148._0_8_;
        local_178 = local_148.info;
        local_138 = TVar8;
        local_128 = TVar7;
        pDVar4 = parseDotMemberClause(in_stack_fffffffffffffca8);
        virtualKeyword_00.info = (Info *)in_stack_fffffffffffffc90;
        virtualKeyword_00._0_8_ = in_stack_fffffffffffffc88;
        interfaceKeyword_00.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
        interfaceKeyword_00._0_8_ = pDVar4;
        name_00.info = (Info *)in_stack_fffffffffffffca8;
        name_00._0_8_ = in_stack_fffffffffffffca0;
        local_8 = (StructUnionTypeSyntax *)
                  slang::syntax::SyntaxFactory::virtualInterfaceType
                            ((SyntaxFactory *)local_178,virtualKeyword_00,interfaceKeyword_00,
                             name_00,local_180,in_stack_fffffffffffffcb0);
      }
      else if (local_2a == UnitSystemName) {
        parseName(in_stack_fffffffffffffc70);
        local_8 = (StructUnionTypeSyntax *)
                  slang::syntax::SyntaxFactory::namedType
                            ((SyntaxFactory *)in_stack_fffffffffffffc70,
                             (NameSyntax *)in_stack_fffffffffffffc68);
      }
      else if (local_2a == Identifier) {
        bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_1e0,AllowImplicit);
        local_1dc = (underlying_type)
                    bitmask<slang::parsing::detail::TypeOptions>::operator&
                              ((bitmask<slang::parsing::detail::TypeOptions> *)
                               CONCAT26(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78),
                               (bitmask<slang::parsing::detail::TypeOptions> *)
                               in_stack_fffffffffffffc70);
        bVar1 = bitmask<slang::parsing::detail::TypeOptions>::operator==
                          ((bitmask<slang::parsing::detail::TypeOptions> *)in_stack_fffffffffffffc70
                           ,(underlying_type)((ulong)in_stack_fffffffffffffc68 >> 0x20));
        if (bVar1) {
          parseName(in_stack_fffffffffffffc70);
          local_8 = (StructUnionTypeSyntax *)
                    slang::syntax::SyntaxFactory::namedType
                              ((SyntaxFactory *)in_stack_fffffffffffffc70,
                               (NameSyntax *)in_stack_fffffffffffffc68);
        }
        else {
          bVar2 = scanQualifiedName(in_stack_fffffffffffffcc8,(uint32_t *)in_stack_fffffffffffffcc0,
                                    (bool)allowNew);
          bVar1 = false;
          if (bVar2) {
            bVar2 = scanDimensionList(in_stack_fffffffffffffc88,
                                      (uint32_t *)in_stack_fffffffffffffc80._M_extent_value);
            bVar1 = false;
            if (bVar2) {
              TVar8 = ParserBase::peek((ParserBase *)
                                       CONCAT26(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78)
                                       ,(uint32_t)((ulong)in_stack_fffffffffffffc70 >> 0x20));
              local_1f8 = TVar8.kind;
              bVar1 = local_1f8 == Identifier;
            }
          }
          if (bVar1) {
            parseName(in_stack_fffffffffffffc70);
            local_8 = (StructUnionTypeSyntax *)
                      slang::syntax::SyntaxFactory::namedType
                                ((SyntaxFactory *)in_stack_fffffffffffffc70,
                                 (NameSyntax *)in_stack_fffffffffffffc68);
          }
          else {
            in_RDI = in_RDI + 0xe0;
            Token::Token((Token *)in_stack_fffffffffffffc70);
            slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
                      ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                       in_stack_fffffffffffffc80._M_extent_value,
                       (nullptr_t)CONCAT26(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78));
            local_250 = ParserBase::placeholderToken(in_stack_fffffffffffffcc0);
            signing_01.info = (Info *)in_stack_fffffffffffffc90;
            signing_01.kind = (short)in_RDI;
            signing_01._2_1_ = (char)((ulong)in_RDI >> 0x10);
            signing_01.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
            signing_01.rawLen = (int)((ulong)in_RDI >> 0x20);
            placeholder.rawLen._2_2_ = in_stack_fffffffffffffc7e;
            placeholder._0_6_ = in_stack_fffffffffffffc78;
            placeholder.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
            local_8 = (StructUnionTypeSyntax *)
                      slang::syntax::SyntaxFactory::implicitType
                                ((SyntaxFactory *)in_stack_fffffffffffffc70,signing_01,
                                 (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                                 in_stack_fffffffffffffc68,placeholder);
          }
        }
      }
      else {
        TVar9 = local_2a;
        local_260 = parseSigning((Parser *)in_stack_fffffffffffffc80._M_extent_value);
        local_270 = parseDimensionList((Parser *)
                                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                                      );
        bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_278,AllowImplicit);
        local_274 = (underlying_type)
                    bitmask<slang::parsing::detail::TypeOptions>::operator&
                              ((bitmask<slang::parsing::detail::TypeOptions> *)
                               CONCAT26(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78),
                               (bitmask<slang::parsing::detail::TypeOptions> *)
                               in_stack_fffffffffffffc70);
        bVar1 = bitmask<slang::parsing::detail::TypeOptions>::operator==
                          ((bitmask<slang::parsing::detail::TypeOptions> *)in_stack_fffffffffffffc70
                           ,(underlying_type)((ulong)in_stack_fffffffffffffc68 >> 0x20));
        if (bVar1) {
          ParserBase::peek(in_stack_fffffffffffffc68);
          Token::location((Token *)&stack0xfffffffffffffd68);
          ParserBase::addDiag((ParserBase *)CONCAT26(TVar9,in_stack_fffffffffffffcd0),
                              in_stack_fffffffffffffce4,in_stack_fffffffffffffcd8);
        }
        _Var6._M_extent_value = in_RDI + 0xe0;
        elements_00._M_ptr._6_2_ = in_stack_fffffffffffffc7e;
        elements_00._M_ptr._0_6_ = in_stack_fffffffffffffc78;
        elements_00._M_extent._M_extent_value = _Var6._M_extent_value;
        slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
                  ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_fffffffffffffc70,
                   elements_00);
        ParserBase::placeholderToken(in_stack_fffffffffffffcc0);
        signing_02.info = (Info *)in_stack_fffffffffffffc90;
        signing_02._0_8_ = in_stack_fffffffffffffc88;
        placeholder_00.rawLen._2_2_ = in_stack_fffffffffffffc7e;
        placeholder_00._0_6_ = in_stack_fffffffffffffc78;
        placeholder_00.info = (Info *)_Var6._M_extent_value;
        local_8 = (StructUnionTypeSyntax *)
                  slang::syntax::SyntaxFactory::implicitType
                            ((SyntaxFactory *)in_stack_fffffffffffffc70,signing_02,
                             (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                             in_stack_fffffffffffffc68,placeholder_00);
      }
    }
    else {
      in_stack_fffffffffffffce4 = (DiagCode)((uint)in_stack_fffffffffffffce4 & 0xffffff);
      if (local_44 == VoidType) {
        bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_d8,AllowVoid);
        local_d4 = (underlying_type)
                   bitmask<slang::parsing::detail::TypeOptions>::operator&
                             ((bitmask<slang::parsing::detail::TypeOptions> *)
                              CONCAT26(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78),
                              (bitmask<slang::parsing::detail::TypeOptions> *)
                              in_stack_fffffffffffffc70);
        bVar1 = bitmask<slang::parsing::detail::TypeOptions>::operator==
                          ((bitmask<slang::parsing::detail::TypeOptions> *)in_stack_fffffffffffffc70
                           ,(underlying_type)((ulong)in_stack_fffffffffffffc68 >> 0x20));
        in_stack_fffffffffffffce4.code._1_1_ = bVar1;
      }
      if (in_stack_fffffffffffffce4.code._1_1_ != '\0') {
        local_dc = 0xbd0005;
        local_f8 = ParserBase::peek(in_stack_fffffffffffffc68);
        local_e8 = Token::location(&local_f8);
        ParserBase::addDiag((ParserBase *)
                            CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0),
                            in_stack_fffffffffffffce4,in_stack_fffffffffffffcd8);
      }
      kind_00 = (SyntaxKind)((ulong)in_stack_fffffffffffffc68 >> 0x20);
      local_108 = ParserBase::consume(in_stack_fffffffffffffc90);
      keyword_00.rawLen._2_2_ = in_stack_fffffffffffffc7e;
      keyword_00._0_6_ = in_stack_fffffffffffffc78;
      keyword_00.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
      local_8 = (StructUnionTypeSyntax *)
                slang::syntax::SyntaxFactory::keywordType
                          ((SyntaxFactory *)in_stack_fffffffffffffc70,kind_00,keyword_00);
    }
  }
  else {
    local_58 = ParserBase::consume(in_stack_fffffffffffffc90);
    TVar7 = parseSigning((Parser *)in_stack_fffffffffffffc80._M_extent_value);
    TVar8 = local_58;
    local_78._0_2_ = local_58.kind;
    local_78._2_1_ = local_58._2_1_;
    local_78._3_1_ = local_58.numFlags.raw;
    local_78._4_4_ = local_58.rawLen;
    local_58.info = TVar8.info;
    local_70 = local_58.info;
    local_68._0_8_ = TVar7._0_8_;
    local_88._0_2_ = local_68.kind;
    local_88._2_1_ = local_68._2_1_;
    local_88._3_1_ = local_68.numFlags.raw;
    local_88._4_4_ = local_68.rawLen;
    local_68.info = TVar7.info;
    local_80 = local_68.info;
    local_68 = TVar7;
    local_58 = TVar8;
    local_d0 = parseDimensionList((Parser *)
                                  CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    elements._M_ptr._6_2_ = in_stack_fffffffffffffc7e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffc78;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffc80._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_fffffffffffffc70,
               elements);
    keyword_01.info = (Info *)in_stack_fffffffffffffc90;
    keyword_01._0_8_ = in_stack_fffffffffffffc88;
    signing_00.rawLen._2_2_ = in_stack_fffffffffffffc7e;
    signing_00._0_6_ = in_stack_fffffffffffffc78;
    signing_00.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
    local_8 = (StructUnionTypeSyntax *)
              slang::syntax::SyntaxFactory::integerType
                        ((SyntaxFactory *)in_stack_fffffffffffffc70,
                         (SyntaxKind)((ulong)local_c0 >> 0x20),keyword_01,signing_00,
                         in_stack_fffffffffffffca0);
  }
  return &local_8->super_DataTypeSyntax;
}

Assistant:

DataTypeSyntax& Parser::parseDataType(bitmask<TypeOptions> options) {
    if (peek(TokenKind::WireKeyword))
        skipToken(diag::WireDataType);

    auto kind = peek().kind;
    auto type = getIntegerType(kind);
    if (type != SyntaxKind::Unknown) {
        auto keyword = consume();
        auto signing = parseSigning();
        return factory.integerType(type, keyword, signing, parseDimensionList());
    }

    type = getKeywordType(kind);
    if (type != SyntaxKind::Unknown) {
        if (type == SyntaxKind::VoidType && (options & TypeOptions::AllowVoid) == 0)
            addDiag(diag::VoidNotAllowed, peek().location());
        return factory.keywordType(type, consume());
    }

    switch (kind) {
        case TokenKind::StructKeyword:
            return parseStructUnion(SyntaxKind::StructType);
        case TokenKind::UnionKeyword:
            return parseStructUnion(SyntaxKind::UnionType);
        case TokenKind::EnumKeyword: {
            auto& result = parseEnum();
            result.previewNode = std::exchange(previewNode, &result);
            return result;
        }
        case TokenKind::VirtualKeyword: {
            auto virtualKeyword = consume();
            auto interfaceKeyword = consumeIf(TokenKind::InterfaceKeyword);
            auto name = expect(TokenKind::Identifier);
            auto parameters = parseParameterValueAssignment();
            return factory.virtualInterfaceType(virtualKeyword, interfaceKeyword, name, parameters,
                                                parseDotMemberClause());
        }
        case TokenKind::UnitSystemName:
            return factory.namedType(parseName());
        case TokenKind::TypeKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseExpression();
            return factory.typeReference(keyword, openParen, expr,
                                         expect(TokenKind::CloseParenthesis));
        }
        default:
            break;
    }

    if (kind == TokenKind::Identifier) {
        if ((options & TypeOptions::AllowImplicit) == 0)
            return factory.namedType(parseName());
        else {
            // If we're allowed to have an implicit type here, it means there's a chance this
            // identifier is actually the name of something else (like a declaration) and that the
            // type should be implicit. Check if there's another identifier right after us
            // before deciding which one we're looking at.
            uint32_t index = 0;
            if (scanQualifiedName(index, /* allowNew */ false) && scanDimensionList(index) &&
                peek(index).kind == TokenKind::Identifier) {
                return factory.namedType(parseName());
            }

            return factory.implicitType(Token(), nullptr, placeholderToken());
        }
    }

    auto signing = parseSigning();
    auto dimensions = parseDimensionList();

    if ((options & TypeOptions::AllowImplicit) == 0)
        addDiag(diag::ImplicitNotAllowed, peek().location());

    return factory.implicitType(signing, dimensions, placeholderToken());
}